

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O3

int CfdGetConfidentialTxOutCount(void *handle,char *tx_hex_string,uint32_t *count)

{
  bool bVar1;
  uint32_t uVar2;
  CfdException *this;
  ConfidentialTransactionContext tx;
  allocator local_109;
  string local_108;
  ConfidentialTransactionContext local_e8;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_108,tx_hex_string,&local_109);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&local_e8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if (count != (uint32_t *)0x0) {
      uVar2 = cfd::core::ConfidentialTransaction::GetTxOutCount
                        (&local_e8.super_ConfidentialTransaction);
      *count = uVar2;
    }
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_e8);
    return 0;
  }
  local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)0x5e1cf2;
  local_e8.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x34a;
  local_e8.super_ConfidentialTransaction.vin_.
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x5e1fd4;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,"tx is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)&local_e8.super_ConfidentialTransaction.vin_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"Failed to parameter. tx is null or empty.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&local_e8);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxOutCount(
    void* handle, const char* tx_hex_string, uint32_t* count) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionContext tx(tx_hex_string);

    if (count != nullptr) {
      *count = tx.GetTxOutCount();
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}